

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

void Cec_ManPatStore(Cec_ManPat_t *p,Vec_Int_t *vPat)

{
  int iVar1;
  int local_24;
  int NumberPrev;
  int Number;
  int i;
  Vec_Int_t *vPat_local;
  Cec_ManPat_t *p_local;
  
  iVar1 = Vec_IntSize(vPat);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vPat) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                  ,0x5a,"void Cec_ManPatStore(Cec_ManPat_t *, Vec_Int_t *)");
  }
  iVar1 = Vec_IntSize(vPat);
  Cec_ManPatStoreNum(p,iVar1);
  local_24 = Vec_IntEntry(vPat,0);
  Cec_ManPatStoreNum(p,local_24);
  NumberPrev = 1;
  while( true ) {
    iVar1 = Vec_IntSize(vPat);
    if (iVar1 <= NumberPrev) {
      return;
    }
    iVar1 = Vec_IntEntry(vPat,NumberPrev);
    if (iVar1 <= local_24) break;
    Cec_ManPatStoreNum(p,iVar1 - local_24);
    NumberPrev = NumberPrev + 1;
    local_24 = iVar1;
  }
  __assert_fail("NumberPrev < Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                ,0x60,"void Cec_ManPatStore(Cec_ManPat_t *, Vec_Int_t *)");
}

Assistant:

static inline void Cec_ManPatStore( Cec_ManPat_t * p, Vec_Int_t * vPat )
{
    int i, Number, NumberPrev;
    assert( Vec_IntSize(vPat) > 0 );
    Cec_ManPatStoreNum( p, Vec_IntSize(vPat) );
    NumberPrev = Vec_IntEntry( vPat, 0 );
    Cec_ManPatStoreNum( p, NumberPrev );
    Vec_IntForEachEntryStart( vPat, Number, i, 1 )
    {
        assert( NumberPrev < Number );
        Cec_ManPatStoreNum( p, Number - NumberPrev );
        NumberPrev = Number;
    }
}